

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

char get_escaped_char(char c,int chr)

{
  int chr_local;
  char c_local;
  char local_1;
  
  switch(c) {
  case '\\':
    local_1 = '\\';
    break;
  default:
    if ((chr == 0) || (c != '\'')) {
      if ((chr == 0) && (c == '\"')) {
        local_1 = '\"';
      }
      else {
        local_1 = '\0';
      }
    }
    else {
      local_1 = '\'';
    }
    break;
  case 'a':
    local_1 = '\a';
    break;
  case 'b':
    local_1 = '\b';
    break;
  case 'f':
    local_1 = '\f';
    break;
  case 'n':
    local_1 = '\n';
    break;
  case 'r':
    local_1 = '\r';
    break;
  case 't':
    local_1 = '\t';
    break;
  case 'v':
    local_1 = '\v';
  }
  return local_1;
}

Assistant:

static char get_escaped_char(char c, int chr)
{
    switch(c)
    {
        case 'a': return '\a';
        case 'b': return '\b';
        case 't': return '\t';
        case 'n': return '\n';
        case 'v': return '\v';
        case 'f': return '\f';
        case 'r': return '\r';
        case '\\': return '\\';
        default:
            if(chr && c == '\'')
                return '\'';
            else if(!chr && c == '"')
                return '"';
            else
                return 0;
    }
}